

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_striped_sse2_128_8.c
# Opt level: O2

parasail_result_t *
parasail_sg_flags_striped_profile_sse2_128_8
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  byte bVar1;
  uint uVar2;
  void *pvVar3;
  parasail_matrix_t *ppVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ulong uVar8;
  char cVar9;
  uint uVar10;
  parasail_result_t *ppVar11;
  __m128i *palVar12;
  __m128i *ptr;
  __m128i *ptr_00;
  int8_t *ptr_01;
  byte bVar13;
  int iVar14;
  int iVar15;
  char *pcVar16;
  int iVar17;
  uint uVar18;
  __m128i *ptr_02;
  uint uVar19;
  long lVar20;
  char *__format;
  int8_t iVar21;
  uint uVar22;
  ulong uVar23;
  ushort uVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  int32_t segNum;
  long lVar28;
  int iVar29;
  ulong uVar30;
  long lVar31;
  undefined4 uVar32;
  undefined1 uVar36;
  undefined1 uVar38;
  undefined1 uVar40;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  ulong uVar46;
  undefined1 auVar47 [16];
  __m128i alVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  __m128i_8_t A;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  __m128i_8_t e;
  __m128i_8_t h;
  char cVar37;
  char cVar39;
  char cVar41;
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar16 = "profile";
  }
  else {
    pvVar3 = (profile->profile8).score;
    if (pvVar3 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar16 = "profile->profile8.score";
    }
    else {
      ppVar4 = profile->matrix;
      if (ppVar4 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar16 = "profile->matrix";
      }
      else {
        uVar2 = profile->s1Len;
        if ((int)uVar2 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar16 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar16 = "s2";
        }
        else if (s2Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar16 = "s2Len";
        }
        else if (open < 0) {
          __format = "%s: %s must be >= 0\n";
          pcVar16 = "open";
        }
        else {
          if (-1 < gap) {
            uVar10 = uVar2 - 1;
            uVar30 = (ulong)uVar2 + 0xf >> 4;
            uVar46 = (ulong)uVar10 % uVar30;
            uVar22 = -open;
            uVar19 = ppVar4->min;
            uVar18 = (uint)(byte)-(char)uVar19;
            if (uVar19 != uVar22 && SBORROW4(uVar19,uVar22) == (int)(uVar19 + open) < 0) {
              uVar18 = open;
            }
            cVar9 = '~' - (char)ppVar4->max;
            ppVar11 = parasail_result_new();
            if (ppVar11 != (parasail_result_t *)0x0) {
              iVar14 = (uint)(s1_end != 0) * 0x10;
              ppVar11->flag =
                   iVar14 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
                   (uint)(s2_end != 0) << 0xf | ppVar11->flag | 0x10100802;
              palVar12 = parasail_memalign___m128i(0x10,uVar30);
              ptr = parasail_memalign___m128i(0x10,uVar30);
              ptr_00 = parasail_memalign___m128i(0x10,uVar30);
              ptr_01 = parasail_memalign_int8_t(0x10,(ulong)(s2Len + 1));
              auVar33._0_4_ = -(uint)((int)((ulong)palVar12 >> 0x20) == 0 && (int)palVar12 == 0);
              auVar33._4_4_ = -(uint)((int)ptr == 0 && (int)((ulong)ptr >> 0x20) == 0);
              auVar33._8_4_ = -(uint)((int)((ulong)ptr_00 >> 0x20) == 0 && (int)ptr_00 == 0);
              auVar33._12_4_ = -(uint)((int)ptr_01 == 0 && (int)((ulong)ptr_01 >> 0x20) == 0);
              iVar14 = movmskps(iVar14,auVar33);
              if (iVar14 == 0) {
                iVar14 = s2Len + -1;
                iVar17 = 0xf - (int)(uVar10 / uVar30);
                uVar40 = (undefined1)((uint)open >> 0x18);
                uVar38 = (undefined1)((uint)open >> 0x10);
                uVar36 = (undefined1)((uint)open >> 8);
                auVar42._4_4_ =
                     (int)(CONCAT35(CONCAT21(CONCAT11(uVar40,uVar40),uVar38),CONCAT14(uVar38,open))
                          >> 0x20);
                auVar42[3] = uVar36;
                auVar42[2] = uVar36;
                auVar42[0] = (undefined1)open;
                auVar42[1] = auVar42[0];
                auVar42._8_8_ = 0;
                auVar33 = pshuflw(auVar42,auVar42,0);
                uVar32 = auVar33._0_4_;
                auVar47._4_4_ = uVar32;
                auVar47._0_4_ = uVar32;
                auVar47._8_4_ = uVar32;
                auVar47._12_4_ = uVar32;
                uVar40 = (undefined1)((uint)gap >> 0x18);
                uVar38 = (undefined1)((uint)gap >> 0x10);
                uVar36 = (undefined1)((uint)gap >> 8);
                auVar43._4_4_ =
                     (int)(CONCAT35(CONCAT21(CONCAT11(uVar40,uVar40),uVar38),CONCAT14(uVar38,gap))
                          >> 0x20);
                auVar43[3] = uVar36;
                auVar43[2] = uVar36;
                auVar43[0] = (undefined1)gap;
                auVar43[1] = auVar43[0];
                auVar43._8_8_ = 0;
                auVar33 = pshuflw(auVar43,auVar43,0);
                uVar32 = auVar33._0_4_;
                bVar13 = (char)uVar18 + 0x81;
                uVar24 = (ushort)bVar13;
                auVar33 = pshuflw(ZEXT216(CONCAT11(bVar13,bVar13)),ZEXT216(CONCAT11(bVar13,bVar13)),
                                  0);
                auVar34._0_4_ = auVar33._0_4_;
                auVar34._4_4_ = auVar34._0_4_;
                auVar34._8_4_ = auVar34._0_4_;
                auVar34._12_4_ = auVar34._0_4_;
                auVar42 = ZEXT216(CONCAT11(cVar9,cVar9));
                auVar42 = pshuflw(auVar42,auVar42,0);
                auVar65._0_4_ = auVar42._0_4_;
                auVar65._4_4_ = auVar65._0_4_;
                auVar65._8_4_ = auVar65._0_4_;
                auVar65._12_4_ = auVar65._0_4_;
                uVar40 = (undefined1)((uint)iVar17 >> 0x18);
                uVar38 = (undefined1)((uint)iVar17 >> 0x10);
                uVar36 = (undefined1)((uint)iVar17 >> 8);
                auVar44._4_4_ =
                     (int)(CONCAT35(CONCAT21(CONCAT11(uVar40,uVar40),uVar38),CONCAT14(uVar38,iVar17)
                                   ) >> 0x20);
                auVar44[3] = uVar36;
                auVar44[2] = uVar36;
                auVar44[0] = (undefined1)iVar17;
                auVar44[1] = auVar44[0];
                auVar44._8_8_ = 0;
                auVar43 = pshuflw(auVar44,auVar44,0);
                cVar9 = auVar43[0];
                cVar37 = auVar43[1];
                cVar39 = auVar43[2];
                cVar41 = auVar43[3];
                lVar31 = (long)(int)uVar22;
                for (uVar23 = 0; uVar23 != uVar30; uVar23 = uVar23 + 1) {
                  lVar20 = lVar31;
                  for (lVar28 = 0; lVar28 != 0x10; lVar28 = lVar28 + 1) {
                    lVar26 = lVar20;
                    if (s1_beg != 0) {
                      lVar26 = 0;
                    }
                    lVar25 = -0x80;
                    if (-0x80 < lVar26) {
                      lVar25 = lVar26;
                    }
                    lVar27 = lVar26 - (ulong)(uint)open;
                    if ((long)(lVar26 - (ulong)(uint)open) < -0x7f) {
                      lVar27 = -0x80;
                    }
                    h.v[lVar28] = (int8_t)lVar25;
                    e.v[lVar28] = (int8_t)lVar27;
                    lVar20 = lVar20 - uVar30 * (uint)gap;
                  }
                  palVar12[uVar23][0] = h.m[0];
                  palVar12[uVar23][1] = h.m[1];
                  ptr_00[uVar23][0] = e.m[0];
                  ptr_00[uVar23][1] = e.m[1];
                  lVar31 = lVar31 - (ulong)(uint)gap;
                }
                *ptr_01 = '\0';
                uVar19 = uVar22;
                for (uVar23 = 1; auVar43 = _DAT_008a1a20, s2Len + 1 != uVar23; uVar23 = uVar23 + 1)
                {
                  iVar21 = -0x80;
                  if (-0x80 < (int)uVar19) {
                    iVar21 = (int8_t)uVar19;
                  }
                  if (s2_beg != 0) {
                    iVar21 = '\0';
                  }
                  ptr_01[uVar23] = iVar21;
                  uVar19 = uVar19 - gap;
                }
                uVar19 = (uint)uVar30;
                uVar23 = 0;
                auVar44 = auVar34;
                auVar54 = auVar34;
                iVar15 = iVar14;
                do {
                  ptr_02 = palVar12;
                  if (uVar23 == (uint)s2Len) {
                    if (s2_end != 0) {
                      iVar29 = 0;
                      while( true ) {
                        uVar30 = auVar54._0_8_;
                        lVar31 = auVar54._8_8_;
                        if (iVar17 <= iVar29) break;
                        auVar54._0_8_ = uVar30 << 8;
                        auVar54._8_8_ = lVar31 << 8 | uVar30 >> 0x38;
                        iVar29 = iVar29 + 1;
                      }
                      uVar24 = auVar54._14_2_ >> 8;
                    }
                    bVar13 = (byte)uVar24;
                    uVar18 = uVar10;
                    if (s1_end != 0) {
                      uVar30 = 0;
                      while( true ) {
                        bVar13 = (byte)uVar24;
                        if ((uVar19 & 0x7ffffff) << 4 == (uint)uVar30) break;
                        uVar22 = ((uint)uVar30 & 0xf) * uVar19 + ((uint)(uVar30 >> 4) & 0xfffffff);
                        if ((int)uVar22 < (int)uVar2) {
                          bVar1 = *(byte *)((long)*ptr_02 + uVar30);
                          if ((char)bVar13 < (char)bVar1) {
                            uVar24 = (ushort)bVar1;
                            iVar15 = iVar14;
                            uVar18 = uVar22;
                          }
                          else {
                            if ((int)uVar18 <= (int)uVar22) {
                              uVar22 = uVar18;
                            }
                            if (iVar15 != iVar14) {
                              uVar22 = uVar18;
                            }
                            if (bVar1 == bVar13) {
                              uVar18 = uVar22;
                            }
                          }
                        }
                        uVar30 = uVar30 + 1;
                      }
                    }
                    if (s2_end == 0 && s1_end == 0) {
                      alVar48 = ptr_02[uVar46];
                      iVar15 = 0;
                      while( true ) {
                        uVar46 = alVar48[0];
                        lVar31 = alVar48[1];
                        if (iVar17 <= iVar15) break;
                        alVar48[0] = uVar46 << 8;
                        alVar48[1] = lVar31 << 8 | uVar46 >> 0x38;
                        iVar15 = iVar15 + 1;
                      }
                      bVar13 = alVar48[1]._7_1_;
                      iVar15 = iVar14;
                      uVar18 = uVar10;
                    }
                    cVar9 = auVar33[0];
                    auVar35[0] = -(auVar65[0] < cVar9);
                    cVar37 = auVar33[1];
                    auVar35[1] = -(auVar65[1] < cVar37);
                    cVar39 = auVar33[2];
                    auVar35[2] = -(auVar65[2] < cVar39);
                    cVar41 = auVar33[3];
                    auVar35[3] = -(auVar65[3] < cVar41);
                    auVar35[4] = -(auVar65[4] < cVar9);
                    auVar35[5] = -(auVar65[5] < cVar37);
                    auVar35[6] = -(auVar65[6] < cVar39);
                    auVar35[7] = -(auVar65[7] < cVar41);
                    auVar35[8] = -(auVar65[8] < cVar9);
                    auVar35[9] = -(auVar65[9] < cVar37);
                    auVar35[10] = -(auVar65[10] < cVar39);
                    auVar35[0xb] = -(auVar65[0xb] < cVar41);
                    auVar35[0xc] = -(auVar65[0xc] < cVar9);
                    auVar35[0xd] = -(auVar65[0xd] < cVar37);
                    auVar35[0xe] = -(auVar65[0xe] < cVar39);
                    auVar35[0xf] = -(auVar65[0xf] < cVar41);
                    cVar9 = auVar42[0];
                    auVar45[0] = -(cVar9 < auVar44[0]);
                    cVar37 = auVar42[1];
                    auVar45[1] = -(cVar37 < auVar44[1]);
                    cVar39 = auVar42[2];
                    auVar45[2] = -(cVar39 < auVar44[2]);
                    cVar41 = auVar42[3];
                    auVar45[3] = -(cVar41 < auVar44[3]);
                    auVar45[4] = -(cVar9 < auVar44[4]);
                    auVar45[5] = -(cVar37 < auVar44[5]);
                    auVar45[6] = -(cVar39 < auVar44[6]);
                    auVar45[7] = -(cVar41 < auVar44[7]);
                    auVar45[8] = -(cVar9 < auVar44[8]);
                    auVar45[9] = -(cVar37 < auVar44[9]);
                    auVar45[10] = -(cVar39 < auVar44[10]);
                    auVar45[0xb] = -(cVar41 < auVar44[0xb]);
                    auVar45[0xc] = -(cVar9 < auVar44[0xc]);
                    auVar45[0xd] = -(cVar37 < auVar44[0xd]);
                    auVar45[0xe] = -(cVar39 < auVar44[0xe]);
                    auVar45[0xf] = -(cVar41 < auVar44[0xf]);
                    auVar45 = auVar45 | auVar35;
                    if ((((((((((((((((auVar45 >> 7 & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0 ||
                                     (auVar45 >> 0xf & (undefined1  [16])0x1) !=
                                     (undefined1  [16])0x0) ||
                                    (auVar45 >> 0x17 & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                                   (auVar45 >> 0x1f & (undefined1  [16])0x1) !=
                                   (undefined1  [16])0x0) ||
                                  (auVar45 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                  ) || (auVar45 >> 0x2f & (undefined1  [16])0x1) !=
                                       (undefined1  [16])0x0) ||
                                (auVar45 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                               || (auVar45 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               ) || (auVar45 >> 0x47 & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                             (auVar45 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar45 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar45 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar45 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar45 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar45 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        auVar45[0xf] < '\0') {
                      *(byte *)&ppVar11->flag = (byte)ppVar11->flag | 0x40;
                      bVar13 = 0;
                      iVar15 = 0;
                      uVar18 = 0;
                    }
                    ppVar11->score = (int)(char)bVar13;
                    ppVar11->end_query = uVar18;
                    ppVar11->end_ref = iVar15;
                    parasail_free(ptr_01);
                    parasail_free(ptr_00);
                    parasail_free(ptr);
                    parasail_free(ptr_02);
                    return ppVar11;
                  }
                  uVar8 = ptr_02[uVar19 - 1][0];
                  auVar55._0_8_ = uVar8 << 8;
                  auVar55._8_8_ = ptr_02[uVar19 - 1][1] << 8 | uVar8 >> 0x38;
                  iVar29 = ppVar4->mapper[(byte)s2[uVar23]];
                  auVar55 = ~auVar43 & ZEXT116((byte)ptr_01[uVar23]) | auVar55;
                  auVar51 = auVar34;
                  for (lVar31 = 0; uVar30 * 0x10 != lVar31; lVar31 = lVar31 + 0x10) {
                    auVar56 = paddsb(auVar55,*(undefined1 (*) [16])
                                              ((long)pvVar3 +
                                              lVar31 + (long)(int)(iVar29 * uVar19) * 0x10));
                    auVar55 = *(undefined1 (*) [16])((long)*ptr_00 + lVar31);
                    auVar62[0] = -(auVar55[0] < auVar56[0]);
                    auVar62[1] = -(auVar55[1] < auVar56[1]);
                    auVar62[2] = -(auVar55[2] < auVar56[2]);
                    auVar62[3] = -(auVar55[3] < auVar56[3]);
                    auVar62[4] = -(auVar55[4] < auVar56[4]);
                    auVar62[5] = -(auVar55[5] < auVar56[5]);
                    auVar62[6] = -(auVar55[6] < auVar56[6]);
                    auVar62[7] = -(auVar55[7] < auVar56[7]);
                    auVar62[8] = -(auVar55[8] < auVar56[8]);
                    auVar62[9] = -(auVar55[9] < auVar56[9]);
                    auVar62[10] = -(auVar55[10] < auVar56[10]);
                    auVar62[0xb] = -(auVar55[0xb] < auVar56[0xb]);
                    auVar62[0xc] = -(auVar55[0xc] < auVar56[0xc]);
                    auVar62[0xd] = -(auVar55[0xd] < auVar56[0xd]);
                    auVar62[0xe] = -(auVar55[0xe] < auVar56[0xe]);
                    auVar62[0xf] = -(auVar55[0xf] < auVar56[0xf]);
                    auVar56 = ~auVar62 & auVar55 | auVar56 & auVar62;
                    auVar57[0] = -(auVar51[0] < auVar56[0]);
                    auVar57[1] = -(auVar51[1] < auVar56[1]);
                    auVar57[2] = -(auVar51[2] < auVar56[2]);
                    auVar57[3] = -(auVar51[3] < auVar56[3]);
                    auVar57[4] = -(auVar51[4] < auVar56[4]);
                    auVar57[5] = -(auVar51[5] < auVar56[5]);
                    auVar57[6] = -(auVar51[6] < auVar56[6]);
                    auVar57[7] = -(auVar51[7] < auVar56[7]);
                    auVar57[8] = -(auVar51[8] < auVar56[8]);
                    auVar57[9] = -(auVar51[9] < auVar56[9]);
                    auVar57[10] = -(auVar51[10] < auVar56[10]);
                    auVar57[0xb] = -(auVar51[0xb] < auVar56[0xb]);
                    auVar57[0xc] = -(auVar51[0xc] < auVar56[0xc]);
                    auVar57[0xd] = -(auVar51[0xd] < auVar56[0xd]);
                    auVar57[0xe] = -(auVar51[0xe] < auVar56[0xe]);
                    auVar57[0xf] = -(auVar51[0xf] < auVar56[0xf]);
                    auVar56 = ~auVar57 & auVar51 | auVar56 & auVar57;
                    *(undefined1 (*) [16])((long)*ptr + lVar31) = auVar56;
                    auVar63[0] = -(auVar56[0] < auVar44[0]);
                    auVar63[1] = -(auVar56[1] < auVar44[1]);
                    auVar63[2] = -(auVar56[2] < auVar44[2]);
                    auVar63[3] = -(auVar56[3] < auVar44[3]);
                    auVar63[4] = -(auVar56[4] < auVar44[4]);
                    auVar63[5] = -(auVar56[5] < auVar44[5]);
                    auVar63[6] = -(auVar56[6] < auVar44[6]);
                    auVar63[7] = -(auVar56[7] < auVar44[7]);
                    auVar63[8] = -(auVar56[8] < auVar44[8]);
                    auVar63[9] = -(auVar56[9] < auVar44[9]);
                    auVar63[10] = -(auVar56[10] < auVar44[10]);
                    auVar63[0xb] = -(auVar56[0xb] < auVar44[0xb]);
                    auVar63[0xc] = -(auVar56[0xc] < auVar44[0xc]);
                    auVar63[0xd] = -(auVar56[0xd] < auVar44[0xd]);
                    auVar63[0xe] = -(auVar56[0xe] < auVar44[0xe]);
                    auVar63[0xf] = -(auVar56[0xf] < auVar44[0xf]);
                    auVar44 = auVar44 & auVar63 | ~auVar63 & auVar56;
                    auVar64[0] = -(auVar56[0] < auVar65[0]);
                    auVar64[1] = -(auVar56[1] < auVar65[1]);
                    auVar64[2] = -(auVar56[2] < auVar65[2]);
                    auVar64[3] = -(auVar56[3] < auVar65[3]);
                    auVar64[4] = -(auVar56[4] < auVar65[4]);
                    auVar64[5] = -(auVar56[5] < auVar65[5]);
                    auVar64[6] = -(auVar56[6] < auVar65[6]);
                    auVar64[7] = -(auVar56[7] < auVar65[7]);
                    auVar64[8] = -(auVar56[8] < auVar65[8]);
                    auVar64[9] = -(auVar56[9] < auVar65[9]);
                    auVar64[10] = -(auVar56[10] < auVar65[10]);
                    auVar64[0xb] = -(auVar56[0xb] < auVar65[0xb]);
                    auVar64[0xc] = -(auVar56[0xc] < auVar65[0xc]);
                    auVar64[0xd] = -(auVar56[0xd] < auVar65[0xd]);
                    auVar64[0xe] = -(auVar56[0xe] < auVar65[0xe]);
                    auVar64[0xf] = -(auVar56[0xf] < auVar65[0xf]);
                    auVar65 = ~auVar64 & auVar65 | auVar56 & auVar64;
                    auVar67[0] = -(auVar55[0] < auVar65[0]);
                    auVar67[1] = -(auVar55[1] < auVar65[1]);
                    auVar67[2] = -(auVar55[2] < auVar65[2]);
                    auVar67[3] = -(auVar55[3] < auVar65[3]);
                    auVar67[4] = -(auVar55[4] < auVar65[4]);
                    auVar67[5] = -(auVar55[5] < auVar65[5]);
                    auVar67[6] = -(auVar55[6] < auVar65[6]);
                    auVar67[7] = -(auVar55[7] < auVar65[7]);
                    auVar67[8] = -(auVar55[8] < auVar65[8]);
                    auVar67[9] = -(auVar55[9] < auVar65[9]);
                    auVar67[10] = -(auVar55[10] < auVar65[10]);
                    auVar67[0xb] = -(auVar55[0xb] < auVar65[0xb]);
                    auVar67[0xc] = -(auVar55[0xc] < auVar65[0xc]);
                    auVar67[0xd] = -(auVar55[0xd] < auVar65[0xd]);
                    auVar67[0xe] = -(auVar55[0xe] < auVar65[0xe]);
                    auVar67[0xf] = -(auVar55[0xf] < auVar65[0xf]);
                    auVar65 = ~auVar67 & auVar65 | auVar55 & auVar67;
                    auVar58[0] = -(auVar51[0] < auVar65[0]);
                    auVar58[1] = -(auVar51[1] < auVar65[1]);
                    auVar58[2] = -(auVar51[2] < auVar65[2]);
                    auVar58[3] = -(auVar51[3] < auVar65[3]);
                    auVar58[4] = -(auVar51[4] < auVar65[4]);
                    auVar58[5] = -(auVar51[5] < auVar65[5]);
                    auVar58[6] = -(auVar51[6] < auVar65[6]);
                    auVar58[7] = -(auVar51[7] < auVar65[7]);
                    auVar58[8] = -(auVar51[8] < auVar65[8]);
                    auVar58[9] = -(auVar51[9] < auVar65[9]);
                    auVar58[10] = -(auVar51[10] < auVar65[10]);
                    auVar58[0xb] = -(auVar51[0xb] < auVar65[0xb]);
                    auVar58[0xc] = -(auVar51[0xc] < auVar65[0xc]);
                    auVar58[0xd] = -(auVar51[0xd] < auVar65[0xd]);
                    auVar58[0xe] = -(auVar51[0xe] < auVar65[0xe]);
                    auVar58[0xf] = -(auVar51[0xf] < auVar65[0xf]);
                    auVar65 = ~auVar58 & auVar65 | auVar51 & auVar58;
                    auVar58 = psubsb(auVar56,auVar47);
                    auVar56._4_4_ = uVar32;
                    auVar56._0_4_ = uVar32;
                    auVar56._8_4_ = uVar32;
                    auVar56._12_4_ = uVar32;
                    auVar55 = psubsb(auVar55,auVar56);
                    auVar66[0] = -(auVar58[0] < auVar55[0]);
                    auVar66[1] = -(auVar58[1] < auVar55[1]);
                    auVar66[2] = -(auVar58[2] < auVar55[2]);
                    auVar66[3] = -(auVar58[3] < auVar55[3]);
                    auVar66[4] = -(auVar58[4] < auVar55[4]);
                    auVar66[5] = -(auVar58[5] < auVar55[5]);
                    auVar66[6] = -(auVar58[6] < auVar55[6]);
                    auVar66[7] = -(auVar58[7] < auVar55[7]);
                    auVar66[8] = -(auVar58[8] < auVar55[8]);
                    auVar66[9] = -(auVar58[9] < auVar55[9]);
                    auVar66[10] = -(auVar58[10] < auVar55[10]);
                    auVar66[0xb] = -(auVar58[0xb] < auVar55[0xb]);
                    auVar66[0xc] = -(auVar58[0xc] < auVar55[0xc]);
                    auVar66[0xd] = -(auVar58[0xd] < auVar55[0xd]);
                    auVar66[0xe] = -(auVar58[0xe] < auVar55[0xe]);
                    auVar66[0xf] = -(auVar58[0xf] < auVar55[0xf]);
                    *(undefined1 (*) [16])((long)*ptr_00 + lVar31) =
                         ~auVar66 & auVar58 | auVar55 & auVar66;
                    auVar6._4_4_ = uVar32;
                    auVar6._0_4_ = uVar32;
                    auVar6._8_4_ = uVar32;
                    auVar6._12_4_ = uVar32;
                    auVar55 = psubsb(auVar51,auVar6);
                    auVar51[0] = -(auVar58[0] < auVar55[0]);
                    auVar51[1] = -(auVar58[1] < auVar55[1]);
                    auVar51[2] = -(auVar58[2] < auVar55[2]);
                    auVar51[3] = -(auVar58[3] < auVar55[3]);
                    auVar51[4] = -(auVar58[4] < auVar55[4]);
                    auVar51[5] = -(auVar58[5] < auVar55[5]);
                    auVar51[6] = -(auVar58[6] < auVar55[6]);
                    auVar51[7] = -(auVar58[7] < auVar55[7]);
                    auVar51[8] = -(auVar58[8] < auVar55[8]);
                    auVar51[9] = -(auVar58[9] < auVar55[9]);
                    auVar51[10] = -(auVar58[10] < auVar55[10]);
                    auVar51[0xb] = -(auVar58[0xb] < auVar55[0xb]);
                    auVar51[0xc] = -(auVar58[0xc] < auVar55[0xc]);
                    auVar51[0xd] = -(auVar58[0xd] < auVar55[0xd]);
                    auVar51[0xe] = -(auVar58[0xe] < auVar55[0xe]);
                    auVar51[0xf] = -(auVar58[0xf] < auVar55[0xf]);
                    auVar51 = auVar55 & auVar51 | ~auVar51 & auVar58;
                    auVar55 = *(undefined1 (*) [16])((long)*ptr_02 + lVar31);
                  }
                  for (iVar29 = 0; iVar29 != 0x10; iVar29 = iVar29 + 1) {
                    uVar18 = uVar22;
                    if (s2_beg == 0) {
                      uVar18 = ptr_01[uVar23 + 1] - open;
                    }
                    if ((int)uVar18 < -0x7f) {
                      uVar18 = 0xffffff80;
                    }
                    auVar52._0_8_ = auVar51._0_8_ << 8;
                    auVar52._8_8_ = auVar51._8_8_ << 8 | auVar51._0_8_ >> 0x38;
                    auVar51 = auVar52 | ~auVar43 & ZEXT416(uVar18);
                    lVar31 = 0;
                    while (uVar30 * 0x10 + 0x10 != lVar31 + 0x10) {
                      auVar55 = *(undefined1 (*) [16])((long)*ptr + lVar31);
                      auVar60[0] = -(auVar51[0] < auVar55[0]);
                      auVar60[1] = -(auVar51[1] < auVar55[1]);
                      auVar60[2] = -(auVar51[2] < auVar55[2]);
                      auVar60[3] = -(auVar51[3] < auVar55[3]);
                      auVar60[4] = -(auVar51[4] < auVar55[4]);
                      auVar60[5] = -(auVar51[5] < auVar55[5]);
                      auVar60[6] = -(auVar51[6] < auVar55[6]);
                      auVar60[7] = -(auVar51[7] < auVar55[7]);
                      auVar60[8] = -(auVar51[8] < auVar55[8]);
                      auVar60[9] = -(auVar51[9] < auVar55[9]);
                      auVar60[10] = -(auVar51[10] < auVar55[10]);
                      auVar60[0xb] = -(auVar51[0xb] < auVar55[0xb]);
                      auVar60[0xc] = -(auVar51[0xc] < auVar55[0xc]);
                      auVar60[0xd] = -(auVar51[0xd] < auVar55[0xd]);
                      auVar60[0xe] = -(auVar51[0xe] < auVar55[0xe]);
                      auVar60[0xf] = -(auVar51[0xf] < auVar55[0xf]);
                      auVar55 = ~auVar60 & auVar51 | auVar55 & auVar60;
                      *(undefined1 (*) [16])((long)*ptr + lVar31) = auVar55;
                      auVar59[0] = -(auVar55[0] < auVar65[0]);
                      auVar59[1] = -(auVar55[1] < auVar65[1]);
                      auVar59[2] = -(auVar55[2] < auVar65[2]);
                      auVar59[3] = -(auVar55[3] < auVar65[3]);
                      auVar59[4] = -(auVar55[4] < auVar65[4]);
                      auVar59[5] = -(auVar55[5] < auVar65[5]);
                      auVar59[6] = -(auVar55[6] < auVar65[6]);
                      auVar59[7] = -(auVar55[7] < auVar65[7]);
                      auVar59[8] = -(auVar55[8] < auVar65[8]);
                      auVar59[9] = -(auVar55[9] < auVar65[9]);
                      auVar59[10] = -(auVar55[10] < auVar65[10]);
                      auVar59[0xb] = -(auVar55[0xb] < auVar65[0xb]);
                      auVar59[0xc] = -(auVar55[0xc] < auVar65[0xc]);
                      auVar59[0xd] = -(auVar55[0xd] < auVar65[0xd]);
                      auVar59[0xe] = -(auVar55[0xe] < auVar65[0xe]);
                      auVar59[0xf] = -(auVar55[0xf] < auVar65[0xf]);
                      auVar65 = ~auVar59 & auVar65 | auVar55 & auVar59;
                      auVar49[0] = -(auVar55[0] < auVar44[0]);
                      auVar49[1] = -(auVar55[1] < auVar44[1]);
                      auVar49[2] = -(auVar55[2] < auVar44[2]);
                      auVar49[3] = -(auVar55[3] < auVar44[3]);
                      auVar49[4] = -(auVar55[4] < auVar44[4]);
                      auVar49[5] = -(auVar55[5] < auVar44[5]);
                      auVar49[6] = -(auVar55[6] < auVar44[6]);
                      auVar49[7] = -(auVar55[7] < auVar44[7]);
                      auVar49[8] = -(auVar55[8] < auVar44[8]);
                      auVar49[9] = -(auVar55[9] < auVar44[9]);
                      auVar49[10] = -(auVar55[10] < auVar44[10]);
                      auVar49[0xb] = -(auVar55[0xb] < auVar44[0xb]);
                      auVar49[0xc] = -(auVar55[0xc] < auVar44[0xc]);
                      auVar49[0xd] = -(auVar55[0xd] < auVar44[0xd]);
                      auVar49[0xe] = -(auVar55[0xe] < auVar44[0xe]);
                      auVar49[0xf] = -(auVar55[0xf] < auVar44[0xf]);
                      auVar44 = auVar44 & auVar49 | ~auVar49 & auVar55;
                      auVar55 = psubsb(auVar55,auVar47);
                      auVar7._4_4_ = uVar32;
                      auVar7._0_4_ = uVar32;
                      auVar7._8_4_ = uVar32;
                      auVar7._12_4_ = uVar32;
                      auVar51 = psubsb(auVar51,auVar7);
                      auVar50[0] = -(auVar55[0] < auVar51[0]);
                      auVar50[1] = -(auVar55[1] < auVar51[1]);
                      auVar50[2] = -(auVar55[2] < auVar51[2]);
                      auVar50[3] = -(auVar55[3] < auVar51[3]);
                      auVar50[4] = -(auVar55[4] < auVar51[4]);
                      auVar50[5] = -(auVar55[5] < auVar51[5]);
                      auVar50[6] = -(auVar55[6] < auVar51[6]);
                      auVar50[7] = -(auVar55[7] < auVar51[7]);
                      auVar50[8] = -(auVar55[8] < auVar51[8]);
                      auVar50[9] = -(auVar55[9] < auVar51[9]);
                      auVar50[10] = -(auVar55[10] < auVar51[10]);
                      auVar50[0xb] = -(auVar55[0xb] < auVar51[0xb]);
                      auVar50[0xc] = -(auVar55[0xc] < auVar51[0xc]);
                      auVar50[0xd] = -(auVar55[0xd] < auVar51[0xd]);
                      auVar50[0xe] = -(auVar55[0xe] < auVar51[0xe]);
                      bVar5 = auVar55[0xf] < auVar51[0xf];
                      auVar50[0xf] = -bVar5;
                      lVar31 = lVar31 + 0x10;
                      if ((((((((((((((((auVar50 >> 7 & (undefined1  [16])0x1) ==
                                        (undefined1  [16])0x0 &&
                                       (auVar50 >> 0xf & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                      (auVar50 >> 0x17 & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0) &&
                                     (auVar50 >> 0x1f & (undefined1  [16])0x1) ==
                                     (undefined1  [16])0x0) &&
                                    (auVar50 >> 0x27 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                                   (auVar50 >> 0x2f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                                  (auVar50 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  ) && (auVar50 >> 0x3f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                (auVar50 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar50 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar50 >> 0x57 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                             (auVar50 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar50 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar50 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar50 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          !bVar5) goto LAB_0051aa3b;
                    }
                  }
LAB_0051aa3b:
                  alVar48 = ptr[uVar46];
                  auVar53[0] = -(auVar54[0] < (char)alVar48[0]);
                  auVar53[1] = -(auVar54[1] < alVar48[0]._1_1_);
                  auVar53[2] = -(auVar54[2] < alVar48[0]._2_1_);
                  auVar53[3] = -(auVar54[3] < alVar48[0]._3_1_);
                  auVar53[4] = -(auVar54[4] < alVar48[0]._4_1_);
                  auVar53[5] = -(auVar54[5] < alVar48[0]._5_1_);
                  auVar53[6] = -(auVar54[6] < alVar48[0]._6_1_);
                  auVar53[7] = -(auVar54[7] < alVar48[0]._7_1_);
                  auVar53[8] = -(auVar54[8] < (char)alVar48[1]);
                  auVar53[9] = -(auVar54[9] < alVar48[1]._1_1_);
                  auVar53[10] = -(auVar54[10] < alVar48[1]._2_1_);
                  auVar53[0xb] = -(auVar54[0xb] < alVar48[1]._3_1_);
                  auVar53[0xc] = -(auVar54[0xc] < alVar48[1]._4_1_);
                  auVar53[0xd] = -(auVar54[0xd] < alVar48[1]._5_1_);
                  auVar53[0xe] = -(auVar54[0xe] < alVar48[1]._6_1_);
                  auVar53[0xf] = -(auVar54[0xf] < alVar48[1]._7_1_);
                  auVar61[1] = -(cVar37 == '\x0e');
                  auVar61[0] = -(cVar9 == '\x0f');
                  auVar61[2] = -(cVar39 == '\r');
                  auVar61[3] = -(cVar41 == '\f');
                  auVar61[4] = -(cVar9 == '\v');
                  auVar61[5] = -(cVar37 == '\n');
                  auVar61[6] = -(cVar39 == '\t');
                  auVar61[7] = -(cVar41 == '\b');
                  auVar61[8] = -(cVar9 == '\a');
                  auVar61[9] = -(cVar37 == '\x06');
                  auVar61[10] = -(cVar39 == '\x05');
                  auVar61[0xb] = -(cVar41 == '\x04');
                  auVar61[0xc] = -(cVar9 == '\x03');
                  auVar61[0xd] = -(cVar37 == '\x02');
                  auVar61[0xe] = -(cVar39 == '\x01');
                  auVar61[0xf] = -(cVar41 == '\0');
                  auVar61 = auVar53 & auVar61;
                  auVar54 = ~auVar53 & auVar54 | (undefined1  [16])alVar48 & auVar53;
                  if ((((((((((((((((auVar61 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                   || (auVar61 >> 0xf & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0) ||
                                  (auVar61 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                  ) || (auVar61 >> 0x1f & (undefined1  [16])0x1) !=
                                       (undefined1  [16])0x0) ||
                                (auVar61 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                               || (auVar61 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               ) || (auVar61 >> 0x37 & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                             (auVar61 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar61 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar61 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar61 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar61 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar61 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar61 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar61 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar61[0xf] < '\0') {
                    iVar15 = (int)uVar23;
                  }
                  uVar23 = uVar23 + 1;
                  palVar12 = ptr;
                  ptr = ptr_02;
                } while( true );
              }
            }
            return (parasail_result_t *)0x0;
          }
          __format = "%s: %s must be >= 0\n";
          pcVar16 = "gap";
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_sg_flags_striped_profile_sse2_128_8",pcVar16);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvE = NULL;
    int8_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int8_t NEG_LIMIT = 0;
    int8_t POS_LIMIT = 0;
    int8_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vPosMask;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile8.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 16; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m128i*)profile->profile8.score;
    vGapO = _mm_set1_epi8(open);
    vGapE = _mm_set1_epi8(gap);
    NEG_LIMIT = (-open < matrix->min ? INT8_MIN + open : INT8_MIN - matrix->min) + 1;
    POS_LIMIT = INT8_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi8(NEG_LIMIT);
    vPosLimit = _mm_set1_epi8(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vPosMask = _mm_cmpeq_epi8(_mm_set1_epi8(position),
            _mm_set_epi8(0,1,2,3,4,5,6,7,8,9,10,11,12,13,14,15));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_8 | PARASAIL_FLAG_LANES_16;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad =  parasail_memalign___m128i(16, segLen);
    pvE      = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int8_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_8_t h;
            __m128i_8_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT8_MIN ? INT8_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT8_MIN ? INT8_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT8_MIN ? INT8_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        __m128i vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        __m128i vH = _mm_slli_si128(pvHStore[segLen - 1], 1);

        /* Correct part of the vProfile */
        const __m128i* vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        __m128i* pv = pvHLoad;
        pvHLoad = pvHStore;
        pvHStore = pv;

        /* insert upper boundary condition */
        vH = _mm_insert_epi8_rpl(vH, boundary[j], 0);

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm_adds_epi8(vH, _mm_load_si128(vP + i));
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm_max_epi8_rpl(vH, vE);
            vH = _mm_max_epi8_rpl(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
            vSaturationCheckMax = _mm_max_epi8_rpl(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm_min_epi8_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi8_rpl(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm_min_epi8_rpl(vSaturationCheckMin, vF);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif

            /* Update vE value. */
            vH = _mm_subs_epi8(vH, vGapO);
            vE = _mm_subs_epi8(vE, vGapE);
            vE = _mm_max_epi8_rpl(vE, vH);
            _mm_store_si128(pvE + i, vE);

            /* Update vF value. */
            vF = _mm_subs_epi8(vF, vGapE);
            vF = _mm_max_epi8_rpl(vF, vH);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = s2_beg ? -open : (boundary[j+1]-open);
            int8_t tmp2 = tmp < INT8_MIN ? INT8_MIN : tmp;
            vF = _mm_slli_si128(vF, 1);
            vF = _mm_insert_epi8_rpl(vF, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi8_rpl(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                vSaturationCheckMin = _mm_min_epi8_rpl(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi8_rpl(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vH = _mm_subs_epi8(vH, vGapO);
                vF = _mm_subs_epi8(vF, vGapE);
                if (! _mm_movemask_epi8(_mm_cmpgt_epi8(vF, vH))) goto end;
                /*vF = _mm_max_epi8_rpl(vF, vH);*/
            }
        }
end:
        {
            /* extract vector containing last value from the column */
            __m128i vCompare;
            vH = _mm_load_si128(pvHStore + offset);
            vCompare = _mm_and_si128(vPosMask, _mm_cmpgt_epi8(vH, vMaxH));
            vMaxH = _mm_max_epi8_rpl(vH, vMaxH);
            if (_mm_movemask_epi8(vCompare)) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 1);
            }
            result->rowcols->score_row[j] = (int8_t) _mm_extract_epi8_rpl (vH, 15);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore + i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm_slli_si128(vMaxH, 1);
        }
        score = (int8_t) _mm_extract_epi8_rpl(vMaxH, 15);
        end_query = s1Len-1;
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int8_t *t = (int8_t*)pvHStore;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
            }
        }
    }

    if (!s1_end && !s2_end) {
        /* extract last value from the last column */
        {
            __m128i vH = _mm_load_si128(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 1);
            }
            score = (int8_t) _mm_extract_epi8_rpl (vH, 15);
            end_ref = s2Len - 1;
            end_query = s1Len - 1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi8(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi8(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}